

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Reader::PerformRemoteGets(BP5Reader *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppvVar3;
  pointer pRVar4;
  long in_RDI;
  void **handle_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<void_*,_std::allocator<void_*>_> *__range3_1;
  future<bool> *f;
  iterator __end3;
  iterator __begin3;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *__range3;
  size_t tid;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> futures;
  size_t nThreads;
  type lf_WaitForGet;
  anon_class_24_3_72065bc4 lf_GetNextHandle;
  mutex mutexReadRequests;
  size_t nextHandle;
  size_t nHandles;
  GetHandle handle;
  VariableBase *VB;
  BP5ArrayRequest *Req;
  iterator __end2;
  iterator __begin2;
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  *__range2;
  vector<void_*,_std::allocator<void_*>_> handles;
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  GetRequests;
  Dims *in_stack_fffffffffffffe38;
  Accuracy *in_stack_fffffffffffffe40;
  future<bool> *in_stack_fffffffffffffe48;
  allocator_type *in_stack_fffffffffffffe50;
  undefined1 *__n;
  type *this_00;
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  *in_stack_fffffffffffffe88;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
  in_stack_fffffffffffffe90;
  unsigned_long *in_stack_fffffffffffffea8;
  __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
  in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 *local_128;
  undefined1 local_119;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> local_118;
  type *local_100;
  undefined1 **local_f8;
  type **local_f0;
  vector<void_*,_std::allocator<void_*>_> *local_e0;
  undefined1 *local_d8;
  undefined8 *local_d0;
  type **local_c8;
  undefined1 local_c0 [40];
  undefined8 local_98;
  type *local_90;
  undefined8 local_88;
  VariableBase *local_70;
  reference local_68;
  BP5ArrayRequest *local_60;
  __normal_iterator<adios2::format::BP5Deserializer::BP5ArrayRequest_*,_std::vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>_>
  local_58;
  undefined1 *local_50;
  vector<void_*,_std::allocator<void_*>_> local_48;
  undefined1 local_30 [32];
  
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::vector((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
            *)in_stack_fffffffffffffe90._M_current,in_stack_fffffffffffffe88);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0xa5fd24);
  local_50 = local_30;
  local_58._M_current =
       (BP5ArrayRequest *)
       std::
       vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
       ::begin((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                *)in_stack_fffffffffffffe38);
  local_60 = (BP5ArrayRequest *)
             std::
             vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
             ::end((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
                    *)in_stack_fffffffffffffe38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<adios2::format::BP5Deserializer::BP5ArrayRequest_*,_std::vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>_>
                             *)in_stack_fffffffffffffe40,
                            (__normal_iterator<adios2::format::BP5Deserializer::BP5ArrayRequest_*,_std::vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>_>
                             *)in_stack_fffffffffffffe38), bVar1) {
    local_68 = __gnu_cxx::
               __normal_iterator<adios2::format::BP5Deserializer::BP5ArrayRequest_*,_std::vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>_>
               ::operator*(&local_58);
    local_70 = adios2::format::BP5Deserializer::GetVariableBaseFromBP5VarRec
                         (*(BP5Deserializer **)(in_RDI + 0x290),local_68->VarRec);
    pRVar4 = std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator->
                       ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)0xa5fdd5
                       );
    in_stack_fffffffffffffe38 = &local_68->Start;
    in_stack_fffffffffffffe40 = &local_70->m_AccuracyRequested;
    in_stack_fffffffffffffe48 = (future<bool> *)local_68->Data;
    iVar2 = (*pRVar4->_vptr_Remote[5])
                      (pRVar4,local_68->VarName,local_68->RelStep,local_68->StepCount,
                       local_68->BlockID,&local_68->Count);
    local_88 = CONCAT44(extraout_var,iVar2);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe50,
               (value_type *)in_stack_fffffffffffffe48);
    __gnu_cxx::
    __normal_iterator<adios2::format::BP5Deserializer::BP5ArrayRequest_*,_std::vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>_>
    ::operator++(&local_58);
  }
  local_90 = (type *)std::vector<void_*,_std::allocator<void_*>_>::size(&local_48);
  local_98 = 0;
  std::mutex::mutex((mutex *)0xa5feae);
  local_d8 = local_c0;
  local_d0 = &local_98;
  local_c8 = &local_90;
  local_f8 = &local_d8;
  local_f0 = &local_90;
  local_e0 = &local_48;
  if ((*(uint *)(in_RDI + 0x788) < 2) || (local_90 < (type *)0x2)) {
    std::vector<void_*,_std::allocator<void_*>_>::begin
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe38);
    std::vector<void_*,_std::allocator<void_*>_>::end
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                               *)in_stack_fffffffffffffe40,
                              (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                               *)in_stack_fffffffffffffe38), bVar1) {
      ppvVar3 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                             *)&stack0xfffffffffffffe90);
      pRVar4 = std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator->
                         ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                          0xa601ae);
      (*pRVar4->_vptr_Remote[6])(pRVar4,*ppvVar3);
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> *)
                 &stack0xfffffffffffffe90);
    }
  }
  else {
    this_00 = local_90;
    if ((type *)(ulong)*(uint *)(in_RDI + 0x788) < local_90) {
      this_00 = (type *)(ulong)*(uint *)(in_RDI + 0x788);
    }
    in_stack_fffffffffffffe50 = (allocator_type *)((long)&this_00[-1].handles + 7);
    __n = &local_119;
    local_100 = this_00;
    std::allocator<std::future<bool>_>::allocator((allocator<std::future<bool>_> *)0xa5ff9a);
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
              ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)this_00,
               (size_type)__n,in_stack_fffffffffffffe50);
    std::allocator<std::future<bool>_>::~allocator((allocator<std::future<bool>_> *)0xa5ffc0);
    for (local_128 = (undefined1 *)0x0;
        local_128 < (undefined1 *)((long)&local_100[-1].handles + 7U); local_128 = local_128 + 1) {
      std::async<adios2::core::engine::BP5Reader::PerformRemoteGets()::__0&,unsigned_long>
                ((launch)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (type *)in_stack_fffffffffffffeb0._M_current,in_stack_fffffffffffffea8);
      std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::operator[]
                (&local_118,(size_type)local_128);
      std::future<bool>::operator=
                ((future<bool> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::future<bool>::~future((future<bool> *)0xa60052);
    }
    std::
    tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/bp5/BP5Reader.cpp:701:26),_unsigned_long>_>
    ::type::operator()(this_00,(size_t)__n);
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::begin
              ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
               in_stack_fffffffffffffe38);
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::end
              ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
               in_stack_fffffffffffffe38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                               *)in_stack_fffffffffffffe40,
                              (__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                               *)in_stack_fffffffffffffe38), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
      ::operator*((__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                   *)&stack0xfffffffffffffeb0);
      std::future<bool>::get((future<bool> *)this_00);
      __gnu_cxx::
      __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
      ::operator++((__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                    *)&stack0xfffffffffffffeb0);
    }
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
              ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
               in_stack_fffffffffffffe50);
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe50);
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::~vector((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
             *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

void BP5Reader::PerformRemoteGets()
{
    // TP startGenerate = NOW();
    auto GetRequests = m_BP5Deserializer->PendingGetRequests;
    std::vector<Remote::GetHandle> handles;
    for (auto &Req : GetRequests)
    {
        VariableBase *VB = m_BP5Deserializer->GetVariableBaseFromBP5VarRec(Req.VarRec);
        auto handle = m_Remote->Get(Req.VarName, Req.RelStep, Req.StepCount, Req.BlockID, Req.Count,
                                    Req.Start, VB->m_AccuracyRequested, Req.Data);
        handles.push_back(handle);
    }

    size_t nHandles = handles.size();
    // TP endGenerate = NOW();
    // double generateTime = DURATION(startGenerate, endGenerate);

    size_t nextHandle = 0;
    std::mutex mutexReadRequests;

    auto lf_GetNextHandle = [&]() -> size_t {
        std::lock_guard<std::mutex> lockGuard(mutexReadRequests);
        size_t reqidx = MaxSizeT;
        if (nextHandle < nHandles)
        {
            reqidx = nextHandle;
            ++nextHandle;
        }
        return reqidx;
    };

    auto lf_WaitForGet = [&](const size_t threadID) -> bool {
        while (true)
        {
            const auto reqidx = lf_GetNextHandle();
            if (reqidx > nHandles)
            {
                break;
            }
            m_Remote->WaitForGet(handles[reqidx]);
            // std::cout << "BP5Reader::PerformRemoteGets: thread " << threadID
            //           << " done with response " << reqidx << std::endl;
        }
        return true;
    };

    if (m_Threads > 1 && nHandles > 1)
    {
        size_t nThreads = (m_Threads < nHandles ? m_Threads : nHandles);
        std::vector<std::future<bool>> futures(nThreads - 1);

        // launch Threads-1 threads to process subsets of handles,
        // then main thread process the last subset
        for (size_t tid = 0; tid < nThreads - 1; ++tid)
        {
            futures[tid] = std::async(std::launch::async, lf_WaitForGet, tid + 1);
        }

        // main thread runs last subset of reads
        lf_WaitForGet(0);

        // wait for all async threads
        for (auto &f : futures)
        {
            f.get();
        }
    }
    else
    {
        for (auto &handle : handles)
        {
            m_Remote->WaitForGet(handle);
        }
    }
}